

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O0

int do_test(hash_testvec *tv)

{
  uint uVar1;
  char *plaintext;
  undefined8 *in_RDI;
  char *buf;
  int i;
  int shifts;
  EVP_MAC *mac;
  EVP_MD *md;
  int ret;
  hash_testvec *in_stack_00000038;
  char *in_stack_00000040;
  EVP_MD *in_stack_00000048;
  int in_stack_00000050;
  hash_testvec *in_stack_00000090;
  char *in_stack_00000098;
  int in_stack_000000a0;
  hash_testvec *in_stack_00000238;
  char *in_stack_00000240;
  EVP_MAC *in_stack_00000248;
  int in_stack_00000250;
  hash_testvec *in_stack_ffffffffffffffc8;
  int iVar2;
  int iVar3;
  long lVar4;
  EVP_MD *local_18;
  uint local_c;
  
  local_c = 0;
  lVar4 = 0;
  ERR_set_mark();
  local_18 = EVP_get_digestbyname((char *)*in_RDI);
  if (((local_18 == (EVP_MD *)0x0) &&
      (local_18 = (EVP_MD *)EVP_MD_fetch(0,*in_RDI), local_18 == (EVP_MD *)0x0)) &&
     (lVar4 = EVP_MAC_fetch(0,*in_RDI), lVar4 == 0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x2f2);
  }
  ERR_pop_to_mark();
  printf("\x1b[1;34mTest %s: %s: \x1b[m",*in_RDI,in_RDI[1]);
  iVar3 = 0x20;
  plaintext = (char *)CRYPTO_malloc(*(int *)(in_RDI + 6) + 0x20,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                    ,0x2fb);
  if (plaintext == (char *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("buf = OPENSSL_malloc(tv->psize + shifts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x2fb);
  }
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    memcpy(plaintext + iVar2,(void *)in_RDI[2],(long)*(int *)(in_RDI + 6));
    if (lVar4 != 0) {
      uVar1 = do_mac(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238);
      local_c = uVar1 | local_c;
    }
    if (local_18 != (EVP_MD *)0x0) {
      if (in_RDI[4] == 0) {
        uVar1 = do_digest(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
      }
      else {
        uVar1 = do_hmac((int)((ulong)lVar4 >> 0x20),(EVP_MD *)CONCAT44(iVar3,iVar2),plaintext,
                        in_stack_ffffffffffffffc8);
      }
      local_c = uVar1 | local_c;
    }
    uVar1 = do_cmac_prov(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    local_c = uVar1 | local_c;
    if (local_c != 0) break;
  }
  CRYPTO_free(plaintext);
  EVP_MAC_free(lVar4);
  EVP_MD_free(local_18);
  if (local_c == 0) {
    printf("\x1b[1;32msuccess\x1b[m\n");
  }
  else {
    printf("\x1b[1;31mfail\x1b[m\n");
  }
  return local_c;
}

Assistant:

static int do_test(const struct hash_testvec *tv)
{
    int ret = 0;
    EVP_MD *md = NULL;
    EVP_MAC *mac = NULL;

    ERR_set_mark();
    T((md = (EVP_MD *)EVP_get_digestbyname(tv->algname))
      || (md = EVP_MD_fetch(NULL, tv->algname, NULL))
      || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL)));
    ERR_pop_to_mark();

    printf(cBLUE "Test %s: %s: " cNORM, tv->algname, tv->name);

    /* Test alignment problems. */
    int shifts = 32;
    int i;
    char *buf;
    T(buf = OPENSSL_malloc(tv->psize + shifts));
    for (i = 0; i < shifts; i++) {
	memcpy(buf + i, tv->plaintext, tv->psize);
	if (mac) {
	    ret |= do_mac(i, mac, buf + i, tv);
	}
	if (md) {
	    if (tv->hmac)
		ret |= do_hmac(i, md, buf + i, tv);
	    else
		ret |= do_digest(i, md, buf + i, tv);
	
	}
	/* Test CMAC provider for applicable entries. */
	ret |= do_cmac_prov(i, buf + i, tv);
	
	/* No need to continue loop on failure. */
	if (ret)
	    break;
    }
    OPENSSL_free(buf);
    EVP_MAC_free(mac);
    EVP_MD_free(md);

    if (!ret)
	printf(cGREEN "success" cNORM "\n");
    else
	printf(cRED "fail" cNORM "\n");
    return ret;
}